

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

bool __thiscall State::isSolvable(State *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int aiStack_68 [3];
  bool local_59;
  bool blankOddRow;
  int iStack_3c;
  bool evenSwaps;
  int nextTile;
  int j_1;
  int tile;
  int i_1;
  int j;
  int i;
  unsigned_long __vla_expr0;
  int local_14;
  int swaps;
  State *this_local;
  
  local_14 = 0;
  lVar3 = -0x68 - ((ulong)(uint)this->size * 4 + 0xf & 0xfffffffffffffff0);
  for (i_1 = 0; i_1 < this->height; i_1 = i_1 + 1) {
    for (tile = 0; tile < this->width; tile = tile + 1) {
      *(int *)((long)aiStack_68 + (long)(this->height * i_1 + tile) * 4 + lVar3 + 0x68) =
           this->tiles[i_1][tile];
    }
  }
  for (j_1 = 0; j_1 < this->size; j_1 = j_1 + 1) {
    iVar1 = *(int *)((long)aiStack_68 + (long)j_1 * 4 + lVar3 + 0x68);
    iStack_3c = j_1;
    if (iVar1 != 0) {
      while (iStack_3c = iStack_3c + 1, iStack_3c < this->size) {
        iVar2 = *(int *)((long)aiStack_68 + (long)iStack_3c * 4 + lVar3 + 0x68);
        if ((iVar2 != 0) && (iVar2 < iVar1)) {
          local_14 = local_14 + 1;
        }
      }
    }
  }
  local_59 = local_14 % 2 == 0;
  if (this->width == 0) {
    local_59 = ((this->height - (this->blank).height) % 2 == 1) == local_59;
  }
  return local_59;
}

Assistant:

bool State::isSolvable() {
    int swaps = 0;
    int flatTiles[size];

    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            flatTiles[height * i + j] = tiles[i][j];
        }
    }

    for (int i = 0; i < size; i++) {
        int tile = flatTiles[i];
        if (tile == 0) continue;

        for (int j = i + 1; j < size; j++) {
            int nextTile = flatTiles[j];
            if (nextTile == 0) continue;

            if (tile > nextTile) {
                swaps++;
            }
        }
    }

    bool evenSwaps = swaps % 2 == 0;
    bool blankOddRow = (height - blank.height) % 2 == 1;

    // Giving credit where credit is due.
    // http://www.cs.bham.ac.uk/~mdr/teaching/modules04/java2/TilesSolvability.html
    return width == 0 ? blankOddRow == evenSwaps : evenSwaps;
}